

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

MemFile * memdbFromDbSchema(sqlite3 *db,char *zSchema)

{
  MemStore *p_00;
  int iVar1;
  int rc;
  MemStore *pStore;
  MemFile *p;
  char *zSchema_local;
  sqlite3 *db_local;
  
  pStore = (MemStore *)0x0;
  p = (MemFile *)zSchema;
  zSchema_local = (char *)db;
  iVar1 = sqlite3_file_control(db,zSchema,7,&pStore);
  if (iVar1 == 0) {
    if ((sqlite3_io_methods *)pStore->sz == &memdb_io_methods) {
      p_00 = (MemStore *)pStore->szAlloc;
      memdbEnter(p_00);
      if (p_00->zFName != (char *)0x0) {
        pStore = (MemStore *)0x0;
      }
      memdbLeave(p_00);
      db_local = (sqlite3 *)pStore;
    }
    else {
      db_local = (sqlite3 *)0x0;
    }
  }
  else {
    db_local = (sqlite3 *)0x0;
  }
  return (MemFile *)db_local;
}

Assistant:

static MemFile *memdbFromDbSchema(sqlite3 *db, const char *zSchema){
  MemFile *p = 0;
  MemStore *pStore;
  int rc = sqlite3_file_control(db, zSchema, SQLITE_FCNTL_FILE_POINTER, &p);
  if( rc ) return 0;
  if( p->base.pMethods!=&memdb_io_methods ) return 0;
  pStore = p->pStore;
  memdbEnter(pStore);
  if( pStore->zFName!=0 ) p = 0;
  memdbLeave(pStore);
  return p;
}